

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseTypeModuleField(WastParser *this,Module *module)

{
  Result RVar1;
  long lVar2;
  Enum EVar3;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  undefined1 auStack_f8 [8];
  BindingHash bindings;
  undefined1 local_b8 [32];
  undefined1 *local_98 [2];
  undefined1 local_88 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  Enum local_4c;
  _Head_base<0UL,_wabt::FuncTypeModuleField_*,_false> local_48;
  FuncTypeModuleField *local_40;
  allocator_type local_31;
  
  RVar1 = Expect(this,Lpar);
  EVar3 = Error;
  if (RVar1.enum_ != Error) {
    GetToken((Token *)local_b8,this);
    bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_bucket_count = local_b8._16_8_;
    bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)local_b8._24_8_;
    auStack_f8 = (undefined1  [8])local_b8._0_8_;
    bindings.
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_buckets = (__buckets_ptr)local_b8._8_8_;
    Token::~Token((Token *)local_b8);
    MakeUnique<wabt::FuncTypeModuleField,wabt::Location>((wabt *)&local_40,(Location *)auStack_f8);
    RVar1 = Expect(this,Last_Bare);
    EVar3 = Error;
    if (RVar1.enum_ != Error) {
      ParseBindVarOpt(this,&(local_40->func_type).name);
      RVar1 = Expect(this,Lpar);
      if (RVar1.enum_ != Error) {
        RVar1 = Expect(this,Func);
        if (RVar1.enum_ != Error) {
          auStack_f8 = (undefined1  [8])
                       &bindings.
                        super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
                        ._M_h._M_rehash_policy._M_next_resize;
          bindings.
          super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
          ._M_h._M_buckets = (__buckets_ptr)&DAT_00000001;
          bindings.
          super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
          ._M_h._M_bucket_count = 0;
          bindings.
          super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
          ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          bindings.
          super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
          ._M_h._M_element_count._0_4_ = 0x3f800000;
          bindings.
          super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
          ._M_h._M_rehash_policy._M_max_load_factor = 0.0;
          bindings.
          super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
          ._M_h._M_rehash_policy._4_4_ = 0;
          bindings.
          super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
          ._M_h._M_rehash_policy._M_next_resize = 0;
          RVar1 = ParseFuncSignature(this,&(local_40->func_type).sig,(BindingHash *)auStack_f8);
          if (RVar1.enum_ != Error) {
            local_b8._0_8_ = local_b8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"param","");
            local_98[0] = local_88;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"result","");
            __l._M_len = 2;
            __l._M_array = (iterator)local_b8;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&local_68,__l,&local_31);
            local_4c = (Enum)ErrorIfLpar(this,&local_68,(char *)0x0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_68);
            lVar2 = 0;
            do {
              if (local_88 + lVar2 != *(undefined1 **)((long)local_98 + lVar2)) {
                operator_delete(*(undefined1 **)((long)local_98 + lVar2));
              }
              lVar2 = lVar2 + -0x20;
            } while (lVar2 != -0x40);
            if (local_4c != Error) {
              RVar1 = Expect(this,Rpar);
              if (RVar1.enum_ != Error) {
                RVar1 = Expect(this,Rpar);
                if (RVar1.enum_ != Error) {
                  local_48._M_head_impl = local_40;
                  local_40 = (FuncTypeModuleField *)0x0;
                  Module::AppendField(module,(unique_ptr<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_>
                                              *)&local_48);
                  if (local_48._M_head_impl != (FuncTypeModuleField *)0x0) {
                    (*((local_48._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).
                      super_ModuleField._vptr_ModuleField[1])();
                  }
                  local_48._M_head_impl = (FuncTypeModuleField *)0x0;
                  EVar3 = Ok;
                }
              }
            }
          }
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
          ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                         *)auStack_f8);
        }
      }
    }
    if (local_40 != (FuncTypeModuleField *)0x0) {
      (*(local_40->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).super_ModuleField.
        _vptr_ModuleField[1])();
    }
  }
  return (Result)EVar3;
}

Assistant:

Result WastParser::ParseTypeModuleField(Module* module) {
  WABT_TRACE(ParseTypeModuleField);
  EXPECT(Lpar);
  auto field = MakeUnique<FuncTypeModuleField>(GetLocation());
  EXPECT(Type);
  ParseBindVarOpt(&field->func_type.name);
  EXPECT(Lpar);
  EXPECT(Func);
  BindingHash bindings;
  CHECK_RESULT(ParseFuncSignature(&field->func_type.sig, &bindings));
  CHECK_RESULT(ErrorIfLpar({"param", "result"}));
  EXPECT(Rpar);
  EXPECT(Rpar);
  module->AppendField(std::move(field));
  return Result::Ok;
}